

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptSymbolObject.h
# Opt level: O1

BOOL __thiscall
Js::JavascriptSymbolObject::GetDiagValueString
          (JavascriptSymbolObject *this,StringBuilder<Memory::ArenaAllocator> *stringBuilder,
          ScriptContext *requestContext)

{
  uint uVar1;
  JavascriptSymbol *pJVar2;
  PropertyRecord *pPVar3;
  uint countNeeded;
  
  pJVar2 = (this->value).ptr;
  if ((pJVar2 != (JavascriptSymbol *)0x0) &&
     ((pJVar2->propertyRecordUsageCache).propertyRecord.ptr != (PropertyRecord *)0x0)) {
    if (pJVar2 == (JavascriptSymbol *)0x0) {
      pPVar3 = (PropertyRecord *)0x0;
    }
    else {
      pPVar3 = (pJVar2->propertyRecordUsageCache).propertyRecord.ptr;
    }
    uVar1 = ((pJVar2->propertyRecordUsageCache).propertyRecord.ptr)->byteCount;
    countNeeded = uVar1 >> 1;
    StringBuilder<Memory::ArenaAllocator>::EnsureBuffer(stringBuilder,countNeeded);
    JavascriptString::CopyHelper(stringBuilder->appendPtr,(char16 *)(pPVar3 + 1),countNeeded);
    stringBuilder->appendPtr =
         (char16 *)((long)stringBuilder->appendPtr + (ulong)(uVar1 & 0xfffffffe));
    stringBuilder->count = stringBuilder->count + countNeeded;
  }
  return 1;
}

Assistant:

inline const PropertyRecord* GetValue()
        {
            if (value == nullptr)
            {
                return nullptr;
            }
            return value->GetValue();
        }